

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# convolve_avx2.h
# Opt level: O0

void populate_coeffs_8tap_avx2(__m128i coeffs_128,__m256i *coeffs)

{
  undefined1 auVar1 [16];
  undefined1 auVar2 [16];
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 (*in_RDI) [32];
  undefined1 auVar11 [16];
  __m256i coeffs_256;
  undefined8 uStack_250;
  undefined8 uStack_248;
  undefined8 uStack_210;
  undefined8 uStack_208;
  undefined8 uStack_1d0;
  undefined8 uStack_1c8;
  undefined8 uStack_190;
  undefined8 uStack_188;
  undefined8 local_140;
  undefined8 uStack_138;
  
  auVar1 = vpinsrw_avx(ZEXT216(0x200),0x200,1);
  auVar1 = vpinsrw_avx(auVar1,0x200,2);
  auVar1 = vpinsrw_avx(auVar1,0x200,3);
  auVar1 = vpinsrw_avx(auVar1,0x200,4);
  auVar1 = vpinsrw_avx(auVar1,0x200,5);
  auVar1 = vpinsrw_avx(auVar1,0x200,6);
  auVar1 = vpinsrw_avx(auVar1,0x200,7);
  auVar2 = vpinsrw_avx(ZEXT216(0x200),0x200,1);
  auVar2 = vpinsrw_avx(auVar2,0x200,2);
  auVar2 = vpinsrw_avx(auVar2,0x200,3);
  auVar2 = vpinsrw_avx(auVar2,0x200,4);
  auVar2 = vpinsrw_avx(auVar2,0x200,5);
  auVar2 = vpinsrw_avx(auVar2,0x200,6);
  auVar2 = vpinsrw_avx(auVar2,0x200,7);
  uStack_250 = auVar2._0_8_;
  uStack_248 = auVar2._8_8_;
  auVar10._8_8_ = uStack_138;
  auVar10._0_8_ = local_140;
  auVar10._16_8_ = local_140;
  auVar10._24_8_ = uStack_138;
  auVar9._16_8_ = uStack_250;
  auVar9._0_16_ = auVar1;
  auVar9._24_8_ = uStack_248;
  auVar3 = vpshufb_avx2(auVar10,auVar9);
  *in_RDI = auVar3;
  auVar1 = vpinsrw_avx(ZEXT216(0x604),0x604,1);
  auVar1 = vpinsrw_avx(auVar1,0x604,2);
  auVar1 = vpinsrw_avx(auVar1,0x604,3);
  auVar1 = vpinsrw_avx(auVar1,0x604,4);
  auVar1 = vpinsrw_avx(auVar1,0x604,5);
  auVar1 = vpinsrw_avx(auVar1,0x604,6);
  auVar1 = vpinsrw_avx(auVar1,0x604,7);
  auVar2 = vpinsrw_avx(ZEXT216(0x604),0x604,1);
  auVar2 = vpinsrw_avx(auVar2,0x604,2);
  auVar2 = vpinsrw_avx(auVar2,0x604,3);
  auVar2 = vpinsrw_avx(auVar2,0x604,4);
  auVar2 = vpinsrw_avx(auVar2,0x604,5);
  auVar2 = vpinsrw_avx(auVar2,0x604,6);
  auVar2 = vpinsrw_avx(auVar2,0x604,7);
  uStack_210 = auVar2._0_8_;
  uStack_208 = auVar2._8_8_;
  auVar8._8_8_ = uStack_138;
  auVar8._0_8_ = local_140;
  auVar8._16_8_ = local_140;
  auVar8._24_8_ = uStack_138;
  auVar7._16_8_ = uStack_210;
  auVar7._0_16_ = auVar1;
  auVar7._24_8_ = uStack_208;
  auVar3 = vpshufb_avx2(auVar8,auVar7);
  in_RDI[1] = auVar3;
  auVar1 = vpinsrw_avx(ZEXT216(0xa08),0xa08,1);
  auVar1 = vpinsrw_avx(auVar1,0xa08,2);
  auVar1 = vpinsrw_avx(auVar1,0xa08,3);
  auVar1 = vpinsrw_avx(auVar1,0xa08,4);
  auVar1 = vpinsrw_avx(auVar1,0xa08,5);
  auVar1 = vpinsrw_avx(auVar1,0xa08,6);
  auVar1 = vpinsrw_avx(auVar1,0xa08,7);
  auVar2 = vpinsrw_avx(ZEXT216(0xa08),0xa08,1);
  auVar2 = vpinsrw_avx(auVar2,0xa08,2);
  auVar2 = vpinsrw_avx(auVar2,0xa08,3);
  auVar2 = vpinsrw_avx(auVar2,0xa08,4);
  auVar2 = vpinsrw_avx(auVar2,0xa08,5);
  auVar2 = vpinsrw_avx(auVar2,0xa08,6);
  auVar2 = vpinsrw_avx(auVar2,0xa08,7);
  uStack_1d0 = auVar2._0_8_;
  uStack_1c8 = auVar2._8_8_;
  auVar6._8_8_ = uStack_138;
  auVar6._0_8_ = local_140;
  auVar6._16_8_ = local_140;
  auVar6._24_8_ = uStack_138;
  auVar5._16_8_ = uStack_1d0;
  auVar5._0_16_ = auVar1;
  auVar5._24_8_ = uStack_1c8;
  auVar3 = vpshufb_avx2(auVar6,auVar5);
  in_RDI[2] = auVar3;
  auVar1 = vpinsrw_avx(ZEXT216(0xe0c),0xe0c,1);
  auVar1 = vpinsrw_avx(auVar1,0xe0c,2);
  auVar1 = vpinsrw_avx(auVar1,0xe0c,3);
  auVar1 = vpinsrw_avx(auVar1,0xe0c,4);
  auVar1 = vpinsrw_avx(auVar1,0xe0c,5);
  auVar1 = vpinsrw_avx(auVar1,0xe0c,6);
  auVar1 = vpinsrw_avx(auVar1,0xe0c,7);
  auVar2 = vpinsrw_avx(ZEXT216(0xe0c),0xe0c,1);
  auVar2 = vpinsrw_avx(auVar2,0xe0c,2);
  auVar2 = vpinsrw_avx(auVar2,0xe0c,3);
  auVar2 = vpinsrw_avx(auVar2,0xe0c,4);
  auVar2 = vpinsrw_avx(auVar2,0xe0c,5);
  auVar2 = vpinsrw_avx(auVar2,0xe0c,6);
  auVar2 = vpinsrw_avx(auVar2,0xe0c,7);
  auVar11 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar1;
  uStack_190 = auVar11._0_8_;
  uStack_188 = auVar11._8_8_;
  auVar4._8_8_ = uStack_138;
  auVar4._0_8_ = local_140;
  auVar4._16_8_ = local_140;
  auVar4._24_8_ = uStack_138;
  auVar3._16_8_ = uStack_190;
  auVar3._0_16_ = ZEXT116(0) * auVar1 + ZEXT116(1) * auVar2;
  auVar3._24_8_ = uStack_188;
  auVar3 = vpshufb_avx2(auVar4,auVar3);
  in_RDI[3] = auVar3;
  return;
}

Assistant:

static inline void populate_coeffs_8tap_avx2(const __m128i coeffs_128,
                                             __m256i coeffs[4]) {
  const __m256i coeffs_256 = _mm256_broadcastsi128_si256(coeffs_128);

  // coeffs 0 1 0 1 0 1 0 1
  coeffs[0] = _mm256_shuffle_epi8(coeffs_256, _mm256_set1_epi16(0x0200u));
  // coeffs 2 3 2 3 2 3 2 3
  coeffs[1] = _mm256_shuffle_epi8(coeffs_256, _mm256_set1_epi16(0x0604u));
  // coeffs 4 5 4 5 4 5 4 5
  coeffs[2] = _mm256_shuffle_epi8(coeffs_256, _mm256_set1_epi16(0x0a08u));
  // coeffs 6 7 6 7 6 7 6 7
  coeffs[3] = _mm256_shuffle_epi8(coeffs_256, _mm256_set1_epi16(0x0e0cu));
}